

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EnsureLetConstScopeSlots
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,FuncInfo *funcInfo)

{
  anon_class_24_3_fef809c4 fn;
  bool bVar1;
  undefined1 local_59;
  anon_class_24_3_fef809c4 ensureLetConstSlots;
  bool callsEval;
  FuncInfo *funcInfo_local;
  ParseNodeBlock *pnodeBlock_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = ParseNodeBlock::GetCallsEval(pnodeBlock);
  local_59 = true;
  if (!bVar1) {
    local_59 = ParseNodeBlock::GetChildCallsEval(pnodeBlock);
  }
  fn._17_7_ = ensureLetConstSlots.funcInfo._1_7_;
  fn.callsEval = local_59;
  fn.funcInfo = funcInfo;
  fn.this = this;
  IterateBlockScopedVariables<ByteCodeGenerator::EnsureLetConstScopeSlots(ParseNodeBlock*,FuncInfo*)::__0>
            (this,pnodeBlock,fn);
  return;
}

Assistant:

void ByteCodeGenerator::EnsureLetConstScopeSlots(ParseNodeBlock *pnodeBlock, FuncInfo *funcInfo)
{
    bool callsEval = pnodeBlock->GetCallsEval() || pnodeBlock->GetChildCallsEval();
    auto ensureLetConstSlots = ([this, funcInfo, callsEval](ParseNode *pnode)
    {
        Symbol *sym = pnode->AsParseNodeVar()->sym;
        if (callsEval || sym->NeedsSlotAlloc(this, funcInfo))
        {
            sym->EnsureScopeSlot(this, funcInfo);
            this->ProcessCapturedSym(sym);
        }
    });
    IterateBlockScopedVariables(pnodeBlock, ensureLetConstSlots);
}